

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

string * __thiscall FIX::Message::toXML(Message *this,string *str)

{
  ostream *poVar1;
  FieldMap *pFVar2;
  string *psVar3;
  string local_248 [36];
  int local_224;
  string local_220;
  int local_200;
  int local_1fc;
  string local_1f8;
  int local_1d8;
  int local_1d4;
  string local_1d0;
  int local_1b0;
  stringstream local_1a0 [8];
  stringstream stream;
  ostream local_190 [376];
  string *local_18;
  string *str_local;
  Message *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"<message>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1b0 = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1b0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"<header>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pFVar2 = &getHeader(this)->super_FieldMap;
  toXMLFields_abi_cxx11_(&local_1d0,this,pFVar2,4);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  local_1d4 = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1d4);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"</header>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1d8 = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1d8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"<body>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  toXMLFields_abi_cxx11_(&local_1f8,this,&this->super_FieldMap,4);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
  local_1fc = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1fc);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"</body>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_200 = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_200);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"<trailer>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pFVar2 = &getTrailer(this)->super_FieldMap;
  toXMLFields_abi_cxx11_(&local_220,this,pFVar2,4);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  local_224 = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_224);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"</trailer>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"</message>");
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  psVar3 = (string *)std::__cxx11::string::operator=((string *)local_18,local_248);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return psVar3;
}

Assistant:

std::string& Message::toXML( std::string& str ) const
{
  std::stringstream stream;
  stream << "<message>"                         << std::endl
         << std::setw(2) << " " << "<header>"   << std::endl
         << toXMLFields(getHeader(), 4)
         << std::setw(2) << " " << "</header>"  << std::endl
         << std::setw(2) << " " << "<body>"     << std::endl
         << toXMLFields(*this, 4)
         << std::setw(2) << " " << "</body>"    << std::endl
         << std::setw(2) << " " << "<trailer>"  << std::endl
         << toXMLFields(getTrailer(), 4)
         << std::setw(2) << " " << "</trailer>" << std::endl
         << "</message>";

  return str = stream.str();
}